

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty-test.c++
# Opt level: O2

Client capnp::_::anon_unknown_0::getPersistentCap
                 (RpcSystem<capnp::rpc::twoparty::VatId> *client,Side side,Tag tag)

{
  Reader hostId_00;
  Reader objectId;
  ClientHook *extraout_RDX;
  Client CVar1;
  Builder local_2a0;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  Builder hostId;
  MallocMessageBuilder objectIdMessage;
  MallocMessageBuilder hostIdMessage;
  
  MallocMessageBuilder::MallocMessageBuilder(&hostIdMessage,8,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnp::rpc::twoparty::VatId>(&hostId,&hostIdMessage.super_MessageBuilder)
  ;
  *(undefined2 *)hostId._builder.data = 0;
  MallocMessageBuilder::MallocMessageBuilder(&objectIdMessage,8,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestSturdyRefObjectId>
            (&local_2a0,&objectIdMessage.super_MessageBuilder);
  *(Tag *)&((WireValue<uint32_t>_conflict *)local_2a0._builder.data)->value = tag;
  StructBuilder::asReader(&hostId._builder);
  MessageBuilder::getRootInternal((Builder *)&local_2a0,&objectIdMessage.super_MessageBuilder);
  PointerBuilder::asReader((PointerBuilder *)&local_2a0);
  hostId_00._reader.capTable = (CapTableReader *)uStack_250;
  hostId_00._reader.segment = (SegmentReader *)local_258;
  hostId_00._reader.data = (void *)local_248;
  hostId_00._reader.pointers = (WirePointer *)uStack_240;
  hostId_00._reader.dataSize = (undefined4)local_238;
  hostId_00._reader.pointerCount = local_238._4_2_;
  hostId_00._reader._38_2_ = local_238._6_2_;
  hostId_00._reader._40_8_ = uStack_230;
  objectId.reader.capTable = (CapTableReader *)uStack_270;
  objectId.reader.segment = (SegmentReader *)local_278;
  objectId.reader.pointer = (WirePointer *)local_268;
  objectId.reader._24_8_ = uStack_260;
  RpcSystemBase::baseRestore(&client->super_RpcSystemBase,hostId_00,objectId);
  MallocMessageBuilder::~MallocMessageBuilder(&objectIdMessage);
  MallocMessageBuilder::~MallocMessageBuilder(&hostIdMessage);
  CVar1.hook.ptr = extraout_RDX;
  CVar1.hook.disposer = (Disposer *)client;
  return (Client)CVar1.hook;
}

Assistant:

Capability::Client getPersistentCap(RpcSystem<rpc::twoparty::VatId>& client,
                                    rpc::twoparty::Side side,
                                    test::TestSturdyRefObjectId::Tag tag) {
  // Create the VatId.
  MallocMessageBuilder hostIdMessage(8);
  auto hostId = hostIdMessage.initRoot<rpc::twoparty::VatId>();
  hostId.setSide(side);

  // Create the SturdyRefObjectId.
  MallocMessageBuilder objectIdMessage(8);
  objectIdMessage.initRoot<test::TestSturdyRefObjectId>().setTag(tag);

  // Connect to the remote capability.
  return client.restore(hostId, objectIdMessage.getRoot<AnyPointer>());
}